

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

_Bool sysbvm_identitySet_find
                (sysbvm_tuple_t set,sysbvm_tuple_t element,sysbvm_tuple_t *outFoundElement)

{
  sysbvm_tuple_t sVar1;
  intptr_t iVar2;
  
  *outFoundElement = 0;
  if ((((set & 0xf) == 0 && set != 0) &&
      (iVar2 = sysbvm_identitySet_scanFor(set,element), -1 < iVar2)) &&
     (sVar1 = *(sysbvm_tuple_t *)(*(long *)(set + 0x18) + 0x10 + iVar2 * 8), sVar1 != 0x3f)) {
    *outFoundElement = sVar1;
    return true;
  }
  return false;
}

Assistant:

SYSBVM_API bool sysbvm_identitySet_find(sysbvm_tuple_t set, sysbvm_tuple_t element, sysbvm_tuple_t *outFoundElement)
{
    *outFoundElement = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(set))
        return false;

    intptr_t elementIndex = sysbvm_identitySet_scanFor(set, element);
    if(elementIndex < 0)
        return false;

    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    sysbvm_array_t *storage = (sysbvm_array_t*)setObject->storage;
    if(storage->elements[elementIndex] == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
        return false;

    *outFoundElement = storage->elements[elementIndex];
    return true;
}